

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O0

void test_basic(void)

{
  quicly_sent_packet_t *pqVar1;
  size_t sVar2;
  size_t cnt;
  quicly_sent_packet_t *sent_1;
  quicly_sent_packet_t *sent;
  quicly_sentmap_iter_t iter;
  size_t i;
  uint64_t at;
  quicly_sentmap_t map;
  undefined6 in_stack_ffffffffffffff88;
  uint16_t in_stack_ffffffffffffff8e;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  quicly_sentmap_t *in_stack_ffffffffffffff98;
  long lVar3;
  undefined8 in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  quicly_sentmap_event_t in_stack_ffffffffffffffb4;
  quicly_sentmap_t *in_stack_ffffffffffffffb8;
  quicly_sentmap_t *in_stack_ffffffffffffffc0;
  ulong local_38;
  ulong local_30;
  quicly_sentmap_t local_28;
  
  quicly_sentmap_init((quicly_sentmap_t *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  for (local_30 = 0; local_30 < 10; local_30 = local_30 + 1) {
    for (local_38 = 1; local_38 < 6; local_38 = local_38 + 1) {
      quicly_sentmap_prepare
                (in_stack_ffffffffffffffb8,
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8,(uint8_t)((ulong)in_stack_ffffffffffffffa0 >> 0x38));
      quicly_sentmap_allocate
                (in_stack_ffffffffffffff98,
                 (quicly_sent_acked_cb)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)
                );
      quicly_sentmap_allocate
                (in_stack_ffffffffffffff98,
                 (quicly_sent_acked_cb)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)
                );
      quicly_sentmap_commit
                ((quicly_sentmap_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8e);
    }
  }
  quicly_sentmap_init_iter
            ((quicly_sentmap_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (quicly_sentmap_iter_t *)CONCAT26(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88))
  ;
  for (local_30 = 0; local_30 < 10; local_30 = local_30 + 1) {
    for (local_38 = 1; local_38 < 6; local_38 = local_38 + 1) {
      pqVar1 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x1367b9);
      _ok((int)(ulong)(pqVar1->packet_number == local_30 * 5 + local_38),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x47);
      _ok((int)(ulong)(pqVar1->sent_at == local_30),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x48);
      _ok((int)(ulong)(pqVar1->ack_epoch == '\0'),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x49);
      _ok((int)(ulong)(pqVar1->cc_bytes_in_flight == 1),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x4a);
      quicly_sentmap_skip((quicly_sentmap_iter_t *)0x13688c);
    }
  }
  pqVar1 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x1368be);
  _ok((int)(ulong)(pqVar1->packet_number == 0xffffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x4e);
  sVar2 = num_blocks(&local_28);
  _ok((int)(ulong)(sVar2 == 10),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x4f);
  quicly_sentmap_init_iter
            ((quicly_sentmap_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (quicly_sentmap_iter_t *)CONCAT26(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88))
  ;
  while (pqVar1 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x13692d), pqVar1->packet_number < 0xb
        ) {
    quicly_sentmap_skip((quicly_sentmap_iter_t *)0x13693d);
  }
  pqVar1 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x136949);
  if (pqVar1->packet_number != 0xb) {
    __assert_fail("quicly_sentmap_get(&iter)->packet_number == 11",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                  ,0x55,"void test_basic(void)");
  }
  while (pqVar1 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x13697c),
        pqVar1->packet_number < 0x29) {
    quicly_sentmap_update
              (in_stack_ffffffffffffffc0,(quicly_sentmap_iter_t *)in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb4);
  }
  _ok((int)(ulong)(on_acked_callcnt == 0x3c),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x58);
  _ok((int)(ulong)(on_acked_ackcnt == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x59);
  lVar3 = 0;
  quicly_sentmap_init_iter
            ((quicly_sentmap_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (quicly_sentmap_iter_t *)CONCAT26(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88))
  ;
  while (pqVar1 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x136a0c),
        pqVar1->packet_number != 0xffffffffffffffff) {
    _ok((int)(ulong)(pqVar1->cc_bytes_in_flight != 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
        0x5e);
    in_stack_ffffffffffffff97 = true;
    if (10 < pqVar1->packet_number) {
      in_stack_ffffffffffffff97 = 0x28 < pqVar1->packet_number;
    }
    _ok((int)(ulong)(byte)in_stack_ffffffffffffff97,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
        0x5f);
    lVar3 = lVar3 + 1;
    quicly_sentmap_skip((quicly_sentmap_iter_t *)0x136aa9);
  }
  _ok((int)(ulong)(lVar3 == 0x14),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x62);
  sVar2 = num_blocks(&local_28);
  _ok((int)(ulong)(sVar2 == 5),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",99)
  ;
  quicly_sentmap_dispose
            ((quicly_sentmap_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  return;
}

Assistant:

static void test_basic(void)
{
    quicly_sentmap_t map;
    uint64_t at;
    size_t i;
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;

    quicly_sentmap_init(&map);

    /* save 50 packets, with 2 frames each */
    for (at = 0; at < 10; ++at) {
        for (i = 1; i <= 5; ++i) {
            quicly_sentmap_prepare(&map, at * 5 + i, at, QUICLY_EPOCH_INITIAL);
            quicly_sentmap_allocate(&map, on_acked);
            quicly_sentmap_allocate(&map, on_acked);
            quicly_sentmap_commit(&map, 1);
        }
    }

    /* check all acks */
    quicly_sentmap_init_iter(&map, &iter);
    for (at = 0; at < 10; ++at) {
        for (i = 1; i <= 5; ++i) {
            const quicly_sent_packet_t *sent = quicly_sentmap_get(&iter);
            ok(sent->packet_number == at * 5 + i);
            ok(sent->sent_at == at);
            ok(sent->ack_epoch == QUICLY_EPOCH_INITIAL);
            ok(sent->cc_bytes_in_flight == 1);
            quicly_sentmap_skip(&iter);
        }
    }
    ok(quicly_sentmap_get(&iter)->packet_number == UINT64_MAX);
    ok(num_blocks(&map) == 150 / 16 + 1);

    /* pop acks between 11 <= packet_number <= 40 */
    quicly_sentmap_init_iter(&map, &iter);
    while (quicly_sentmap_get(&iter)->packet_number <= 10)
        quicly_sentmap_skip(&iter);
    assert(quicly_sentmap_get(&iter)->packet_number == 11);
    while (quicly_sentmap_get(&iter)->packet_number <= 40)
        quicly_sentmap_update(&map, &iter, QUICLY_SENTMAP_EVENT_EXPIRED);
    ok(on_acked_callcnt == 30 * 2);
    ok(on_acked_ackcnt == 0);

    size_t cnt = 0;
    for (quicly_sentmap_init_iter(&map, &iter); (sent = quicly_sentmap_get(&iter))->packet_number != UINT64_MAX;
         quicly_sentmap_skip(&iter)) {
        ok(sent->cc_bytes_in_flight != 0);
        ok(sent->packet_number <= 10 || 40 < sent->packet_number);
        ++cnt;
    }
    ok(cnt == 20);
    ok(num_blocks(&map) == 30 / 16 + 1 + 1 + 30 / 16 + 1);

    quicly_sentmap_dispose(&map);
}